

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

int rply_face_callback(p_ply_argument argument)

{
  runtime_error *this;
  p_ply_argument in_RDI;
  double dVar1;
  long index;
  long value_index;
  long length;
  int *buffer;
  long local_40 [3];
  long local_28;
  long local_20;
  void *local_18;
  p_ply_argument local_10;
  
  local_10 = in_RDI;
  ply_get_argument_user_data(in_RDI,&local_18,(long *)0x0);
  ply_get_argument_property(local_10,(p_ply_property *)0x0,&local_20,&local_28);
  if (local_28 == -1) {
    if (local_20 != 3) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"Found face with vertex count different from 3, only triangles are supported")
      ;
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    ply_get_argument_element(local_10,(p_ply_element *)0x0,local_40);
    dVar1 = ply_get_argument_value(local_10);
    *(int *)((long)local_18 + (local_40[0] * 3 + local_28) * 4) = (int)dVar1;
  }
  return 1;
}

Assistant:

static int rply_face_callback(p_ply_argument argument) {
  int* buffer;
  ply_get_argument_user_data(argument, (void**)&buffer, nullptr);

  long length, value_index;
  ply_get_argument_property(argument, nullptr, &length, &value_index);

  // the first value of a list property, the one that gives the number of entries
  if (value_index == -1) {
    if (length != 3) {
      // NOTE: we can also handles quads if necessary (length == 4)
      throw std::runtime_error("Found face with vertex count different from 3, only triangles are supported");
    }
    return 1; // continue;
  }

  long index;
  ply_get_argument_element(argument, nullptr, &index);
  buffer[index * 3 + value_index] = (int)ply_get_argument_value(argument);
  return 1;
}